

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O1

void Div_CubePrintOne(Vec_Int_t *vCube,Vec_Str_t *vStr,int nVars)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  
  if (vStr->nCap < nVars) {
    if (vStr->pArray == (char *)0x0) {
      pcVar2 = (char *)malloc((long)nVars);
    }
    else {
      pcVar2 = (char *)realloc(vStr->pArray,(long)nVars);
    }
    vStr->pArray = pcVar2;
    vStr->nCap = nVars;
  }
  vStr->nSize = nVars;
  if (0 < nVars) {
    lVar3 = 0;
    do {
      vStr->pArray[lVar3] = '-';
      lVar3 = lVar3 + 1;
    } while (lVar3 < vStr->nSize);
  }
  if (0 < vCube->nSize) {
    lVar3 = 0;
    do {
      uVar1 = vCube->pArray[lVar3];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (vStr->nSize <= (int)(uVar1 >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vStr->pArray[uVar1 >> 1] = (byte)uVar1 & 1 ^ 0x31;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCube->nSize);
  }
  puts(vStr->pArray);
  return;
}

Assistant:

void Div_CubePrintOne( Vec_Int_t * vCube, Vec_Str_t * vStr, int nVars )
{
    int i, Lit;
    Vec_StrFill( vStr, nVars, '-' );
    Vec_IntForEachEntry( vCube, Lit, i )
        Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit) ? '0' : '1') );
    printf( "%s\n", Vec_StrArray(vStr) );
}